

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void col_txfm_8x8_rounding(__m256i *in,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  __m256i alVar9;
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  
  iVar10 = 1 << ((char)shift - 1U & 0x1f);
  auVar11._4_4_ = iVar10;
  auVar11._0_4_ = iVar10;
  auVar11._8_4_ = iVar10;
  auVar11._12_4_ = iVar10;
  auVar11._16_4_ = iVar10;
  auVar11._20_4_ = iVar10;
  auVar11._24_4_ = iVar10;
  auVar11._28_4_ = iVar10;
  auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])*in);
  auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])in[1]);
  auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])in[2]);
  auVar4 = vpaddd_avx2(auVar11,(undefined1  [32])in[3]);
  auVar5 = vpaddd_avx2(auVar11,(undefined1  [32])in[4]);
  auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])in[5]);
  auVar7 = vpaddd_avx2(auVar11,(undefined1  [32])in[6]);
  auVar11 = vpaddd_avx2(auVar11,(undefined1  [32])in[7]);
  alVar8 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)shift));
  alVar9 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)shift));
  *in = alVar8;
  in[1] = alVar9;
  auVar12 = ZEXT416((uint)shift);
  alVar8 = (__m256i)vpsrad_avx2(auVar3,auVar12);
  in[2] = alVar8;
  alVar8 = (__m256i)vpsrad_avx2(auVar4,auVar12);
  in[3] = alVar8;
  alVar8 = (__m256i)vpsrad_avx2(auVar5,auVar12);
  alVar9 = (__m256i)vpsrad_avx2(auVar6,auVar12);
  in[4] = alVar8;
  in[5] = alVar9;
  alVar8 = (__m256i)vpsrad_avx2(auVar7,ZEXT416((uint)shift));
  in[6] = alVar8;
  alVar8 = (__m256i)vpsrad_avx2(auVar11,ZEXT416((uint)shift));
  in[7] = alVar8;
  return;
}

Assistant:

static inline void col_txfm_8x8_rounding(__m256i *in, int shift) {
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));

  in[0] = _mm256_add_epi32(in[0], rounding);
  in[1] = _mm256_add_epi32(in[1], rounding);
  in[2] = _mm256_add_epi32(in[2], rounding);
  in[3] = _mm256_add_epi32(in[3], rounding);
  in[4] = _mm256_add_epi32(in[4], rounding);
  in[5] = _mm256_add_epi32(in[5], rounding);
  in[6] = _mm256_add_epi32(in[6], rounding);
  in[7] = _mm256_add_epi32(in[7], rounding);

  in[0] = _mm256_srai_epi32(in[0], shift);
  in[1] = _mm256_srai_epi32(in[1], shift);
  in[2] = _mm256_srai_epi32(in[2], shift);
  in[3] = _mm256_srai_epi32(in[3], shift);
  in[4] = _mm256_srai_epi32(in[4], shift);
  in[5] = _mm256_srai_epi32(in[5], shift);
  in[6] = _mm256_srai_epi32(in[6], shift);
  in[7] = _mm256_srai_epi32(in[7], shift);
}